

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

RealType __thiscall
OpenMD::SelectionEvaluator::getCharge(SelectionEvaluator *this,Atom *atom,int frame)

{
  bool bVar1;
  AtomType *AT;
  Atom *in_RSI;
  RealType RVar2;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  RealType charge;
  int in_stack_ffffffffffffffcc;
  FixedChargeAdapter in_stack_ffffffffffffffd0;
  double local_20;
  
  local_20 = 0.0;
  AT = Atom::getAtomType(in_RSI);
  FixedChargeAdapter::FixedChargeAdapter((FixedChargeAdapter *)&stack0xffffffffffffffd0,AT);
  bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x322973);
  if (bVar1) {
    local_20 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffffd0.at_);
  }
  FluctuatingChargeAdapter::FluctuatingChargeAdapter
            ((FluctuatingChargeAdapter *)&stack0xffffffffffffffc8,AT);
  bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x32299e);
  if (bVar1) {
    RVar2 = StuntDouble::getFlucQPos
                      ((StuntDouble *)in_stack_ffffffffffffffd0.at_,in_stack_ffffffffffffffcc);
    local_20 = RVar2 + local_20;
  }
  return local_20;
}

Assistant:

RealType SelectionEvaluator::getCharge(Atom* atom, int frame) {
    RealType charge    = 0.0;
    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(frame); }
    return charge;
  }